

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

thousands_sep_result<char> * fmt::v8::detail::thousands_sep_impl<char>(locale_ref loc)

{
  numpunct *pnVar1;
  ulong uVar2;
  thousands_sep_result<char> *in_RDI;
  char thousands_sep;
  string grouping;
  numpunct<char> *facet;
  char local_79;
  thousands_sep_result<char> *this;
  string local_50 [48];
  locale local_20 [8];
  numpunct *local_18;
  
  this = in_RDI;
  locale_ref::get<std::locale>((locale_ref *)in_RDI);
  pnVar1 = std::use_facet<std::__cxx11::numpunct<char>>(local_20);
  std::locale::~locale(local_20);
  local_18 = pnVar1;
  std::__cxx11::numpunct<char>::grouping();
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_79 = std::__cxx11::numpunct<char>::thousands_sep();
  }
  else {
    local_79 = '\0';
  }
  std::__cxx11::string::string((string *)this,local_50);
  this->thousands_sep = local_79;
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

FMT_FUNC auto thousands_sep_impl(locale_ref loc) -> thousands_sep_result<Char> {
  auto& facet = std::use_facet<std::numpunct<Char>>(loc.get<std::locale>());
  auto grouping = facet.grouping();
  auto thousands_sep = grouping.empty() ? Char() : facet.thousands_sep();
  return {std::move(grouping), thousands_sep};
}